

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O3

bool __thiscall cursespp::ListOverlay::KeyPress(ListOverlay *this,string *key)

{
  pointer pcVar1;
  OverlayStack *this_00;
  bool bVar2;
  int iVar3;
  size_t index;
  ListWindow *sender;
  ListOverlay *local_68;
  shared_ptr<cursespp::IScrollAdapter> local_60;
  unsigned_long local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((this->keyInterceptorCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    pcVar1 = (key->_M_dataplus)._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + key->_M_string_length);
    if ((this->keyInterceptorCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
      local_68 = this;
      std::__throw_bad_function_call();
    }
    local_68 = this;
    bVar2 = (*(this->keyInterceptorCallback)._M_invoker)
                      ((_Any_data *)&this->keyInterceptorCallback,&local_68,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      return true;
    }
  }
  iVar3 = std::__cxx11::string::compare((char *)key);
  if (iVar3 == 0) {
    this_00 = (this->super_OverlayBase).stack;
    if (this_00 == (OverlayStack *)0x0) {
      return true;
    }
    OverlayStack::Remove(this_00,&(this->super_OverlayBase).super_LayoutBase.super_ILayout);
    (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
      _vptr_IOrderable[0x4e])(this);
    return true;
  }
  sender = (ListWindow *)0x18b311;
  iVar3 = std::__cxx11::string::compare((char *)key);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)key);
    if (((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)key), iVar3 != 0)) ||
       ((this->deleteKeyCallback).super__Function_base._M_manager == (_Manager_type)0x0)) {
      bVar2 = LayoutBase::KeyPress((LayoutBase *)this,key);
      return bVar2;
    }
    local_60.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->adapter).super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_60.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (this->adapter).super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
    if (local_60.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_60.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_60.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_60.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_50 = (**(code **)(*(long *)&(((this->listWindow).
                                        super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_ListWindow).super_ScrollableWindow.
                                      super_Window.super_IWindow.super_IOrderable + 0x228))();
    if ((this->deleteKeyCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_68 = this;
      (*(this->deleteKeyCallback)._M_invoker)
                ((_Any_data *)&this->deleteKeyCallback,&local_68,&local_60,&local_50);
      if (local_60.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return true;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      return true;
    }
    local_68 = this;
    std::__throw_bad_function_call();
  }
  index = (**(code **)(*(long *)&(((this->listWindow).
                                   super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_ListWindow).super_ScrollableWindow.super_Window.
                                 super_IWindow.super_IOrderable + 0x228))();
  OnListEntryActivated(this,sender,index);
  return true;
}

Assistant:

bool ListOverlay::KeyPress(const std::string& key) {
    if (keyInterceptorCallback && keyInterceptorCallback(this, key)) {
        return true;
    }
    else if (key == "^[") { /* esc closes */
        this->Dismiss();
        return true;
    }
    else if (key == " ") { /* space bar also toggles activation */
        this->OnListEntryActivated(
            this->listWindow.get(),
            this->listWindow->GetSelectedIndex());
        return true;
    }
    else if (key == "KEY_BACKSPACE" || key == "KEY_DC") {
        if (deleteKeyCallback) {
            deleteKeyCallback(
                this,
                this->adapter,
                listWindow->GetSelectedIndex());

            return true;
        }
    }

    return LayoutBase::KeyPress(key);
}